

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  weighted_vec *pwVar1;
  dxt5_block *pdVar2;
  weighted_vec *pwVar3;
  vector<unsigned_int> *pvVar4;
  void *pvVar5;
  uint *puVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined8 *puVar11;
  ulong uVar12;
  uint uVar13;
  uint cur_size;
  int iVar14;
  int iVar15;
  ulong uVar16;
  float *pfVar17;
  uint y;
  int iVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  vec16F sv;
  weighted_selector_vec_array selector_vecs [2];
  vector<unsigned_int> selector_vec_remap [2];
  ulong local_d8;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  weighted_vec *local_88 [2];
  weighted_vec_array local_78;
  void *local_68 [2];
  elemental_vector local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_68[0] = (void *)0x0;
  local_68[1] = (void *)0x0;
  local_78.m_p = (weighted_vec *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58.m_p = (void *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  local_d8 = 0;
  do {
    if (this->m_num_blocks != 0) {
      uVar13 = 0;
      do {
        pdVar2 = this->m_pDst_elements;
        uVar9 = this->m_elements_per_block * uVar13;
        if (local_d8 == pdVar2[uVar9].m_endpoints[0] <= pdVar2[uVar9].m_endpoints[1]) {
          pdVar2 = pdVar2 + uVar9;
          iVar10 = 0;
          uVar12 = 0;
          pfVar17 = (float *)local_b8;
          bVar23 = false;
          iVar18 = 0;
          do {
            iVar15 = (int)uVar12;
            iVar14 = 0;
            do {
              uVar9 = (uint)pdVar2->m_selectors[uVar12 >> 3];
              if ((uint)(iVar10 + iVar14) < 0xe) {
                uVar9 = (uint)CONCAT11(pdVar2->m_selectors[(uVar12 >> 3) + 1],
                                       pdVar2->m_selectors[uVar12 >> 3]);
              }
              uVar9 = uVar9 >> ((byte)uVar12 & 7) & 7;
              puVar11 = &g_dxt5_to_linear;
              if ((pdVar2->m_endpoints[1] < pdVar2->m_endpoints[0]) ||
                 (puVar11 = &g_dxt5_alpha6_to_linear, uVar9 < 6)) {
                fVar25 = (float)*(byte *)((long)puVar11 + (ulong)uVar9);
              }
              else {
                bVar23 = true;
                fVar25 = 0.0;
              }
              *pfVar17 = fVar25;
              pfVar17 = pfVar17 + 1;
              iVar14 = iVar14 + 1;
              uVar12 = (ulong)((int)uVar12 + 3);
            } while (iVar14 != 4);
            iVar18 = iVar18 + 1;
            uVar12 = (ulong)(iVar15 + 0xc);
            iVar10 = iVar10 + 4;
          } while (iVar18 != 4);
          if (!bVar23) {
            iVar10 = (uint)pdVar2->m_endpoints[0] - (uint)pdVar2->m_endpoints[1];
            uVar9 = iVar10 * iVar10;
            uVar19 = uVar9 >> 3;
            if (0x7ff < uVar19) {
              uVar19 = 0x800;
            }
            if (uVar9 < 8) {
              uVar19 = 1;
            }
            uVar12 = (ulong)*(uint *)(local_68 + local_d8 * 2 + -1);
            uVar9 = *(uint *)(local_68 + local_d8 * 2 + -1) + 1;
            if ((uVar12 != 0xffffffff) && (*(uint *)((long)local_68 + local_d8 * 0x10 + -4) < uVar9)
               ) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)(&local_78 + local_d8),uVar9,true,0x44,
                         vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         ::object_mover,false);
            }
            *(uint *)(local_68 + local_d8 * 2 + -1) = uVar9;
            pwVar3 = (&local_78)[local_d8].m_p;
            *(weighted_vec **)(pwVar3[uVar12].m_vec.m_s + 0xc) = local_88[0];
            *(weighted_vec **)(pwVar3[uVar12].m_vec.m_s + 0xe) = local_88[1];
            *(undefined8 *)(pwVar3[uVar12].m_vec.m_s + 8) = local_98;
            *(undefined8 *)(pwVar3[uVar12].m_vec.m_s + 10) = uStack_90;
            *(undefined8 *)(pwVar3[uVar12].m_vec.m_s + 4) = local_a8;
            *(undefined8 *)(pwVar3[uVar12].m_vec.m_s + 6) = uStack_a0;
            pwVar1 = pwVar3 + uVar12;
            (pwVar1->m_vec).m_s[0] = (float)local_b8._0_4_;
            (pwVar1->m_vec).m_s[1] = (float)local_b8._4_4_;
            (pwVar1->m_vec).m_s[2] = (float)uStack_b0;
            (pwVar1->m_vec).m_s[3] = uStack_b0._4_4_;
            pwVar3[uVar12].m_weight = uVar19;
            if ((&local_58)[local_d8].m_capacity <= (&local_58)[local_d8].m_size) {
              elemental_vector::increase_capacity
                        (&local_58 + local_d8,(&local_58)[local_d8].m_size + 1,true,4,
                         (object_mover)0x0,false);
            }
            *(uint *)((long)(&local_58)[local_d8].m_p + (ulong)(&local_58)[local_d8].m_size * 4) =
                 uVar13;
            (&local_58)[local_d8].m_size = (&local_58)[local_d8].m_size + 1;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < this->m_num_blocks);
    }
    bVar23 = local_d8 == 0;
    local_d8 = local_d8 + 1;
  } while (bVar23);
  pvVar4 = selector_cluster_indices->m_p;
  if (pvVar4 != (vector<unsigned_int> *)0x0) {
    uVar13 = selector_cluster_indices->m_size;
    if ((ulong)uVar13 != 0) {
      lVar21 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar4->m_p + lVar21);
        if (pvVar5 != (void *)0x0) {
          crnlib_free(pvVar5);
        }
        lVar21 = lVar21 + 0x10;
      } while ((ulong)uVar13 << 4 != lVar21);
    }
    crnlib_free(selector_cluster_indices->m_p);
    selector_cluster_indices->m_p = (vector<unsigned_int> *)0x0;
    selector_cluster_indices->m_size = 0;
    selector_cluster_indices->m_capacity = 0;
  }
  bVar23 = false;
  lVar21 = 0;
  do {
    uVar12 = (ulong)*(uint *)(local_68 + lVar21 * 2 + -1);
    if (uVar12 != 0) {
      uVar13 = this->m_num_blocks;
      if (0.01 <= (float)uVar12 / (float)uVar13) {
        uVar13 = (uint)(((ulong)(uVar13 - 1) + uVar12 * max_selector_clusters) / (ulong)uVar13);
        if (uVar13 < 0x41) {
          uVar13 = 0x40;
        }
        bVar24 = false;
        if (uVar13 < *(uint *)(local_68 + lVar21 * 2 + -1)) {
          local_b8 = (undefined1  [8])0x0;
          uStack_b0 = 0;
          if (lVar21 == 0) {
            this->m_progress_start = this->m_progress_range;
            this->m_progress_range = 0x10;
          }
          else {
            this->m_progress_start = this->m_progress_range + 0x10;
            this->m_progress_range = 0x11;
          }
          bVar8 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                            (&this->m_selector_clusterizer,&local_78 + lVar21,uVar13,
                             (vector<crnlib::vector<unsigned_int>_> *)local_b8,
                             generate_codebook_progress_callback,this);
          bVar24 = true;
          if (bVar8) {
            uVar13 = selector_cluster_indices->m_size;
            if ((float)uStack_b0 != 0.0) {
              uVar9 = (int)(float)uStack_b0 + uVar13;
              if (uVar9 < uVar13) {
                pvVar4 = selector_cluster_indices->m_p;
                uVar20 = -(int)(float)uStack_b0;
                lVar22 = 0;
                do {
                  pvVar5 = *(void **)((long)&pvVar4[uVar9].m_p + lVar22);
                  if (pvVar5 != (void *)0x0) {
                    crnlib_free(pvVar5);
                  }
                  lVar22 = lVar22 + 0x10;
                } while ((ulong)uVar20 << 4 != lVar22);
              }
              else {
                if (selector_cluster_indices->m_capacity < uVar9) {
                  elemental_vector::increase_capacity
                            ((elemental_vector *)selector_cluster_indices,uVar9,true,0x10,
                             (object_mover)0x0,false);
                }
                uVar20 = selector_cluster_indices->m_size;
                if (uVar9 != uVar20) {
                  memset(selector_cluster_indices->m_p + uVar20,0,(ulong)(uVar9 - uVar20) << 4);
                }
              }
              selector_cluster_indices->m_size = uVar9;
            }
            bVar24 = false;
            if ((float)uStack_b0 != 0.0) {
              uVar12 = 0;
              do {
                uVar9 = (int)uVar12 + uVar13;
                pvVar4 = selector_cluster_indices->m_p;
                puVar6 = pvVar4[uVar9].m_p;
                pvVar4[uVar9].m_p = ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_p;
                ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_p = puVar6;
                uVar19 = pvVar4[uVar9].m_size;
                pvVar4[uVar9].m_size =
                     ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_size;
                ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_size = uVar19;
                uVar19 = pvVar4[uVar9].m_capacity;
                pvVar4[uVar9].m_capacity =
                     ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_capacity;
                ((vector<unsigned_int> *)((long)local_b8 + uVar12 * 0x10))->m_capacity = uVar19;
                if (pvVar4[uVar9].m_size != 0) {
                  pvVar5 = (&local_58)[lVar21].m_p;
                  uVar16 = 0;
                  do {
                    puVar6 = pvVar4[uVar9].m_p;
                    puVar6[uVar16] = *(uint *)((long)pvVar5 + (ulong)puVar6[uVar16] * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar16 < pvVar4[uVar9].m_size);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < (uStack_b0 & 0xffffffff));
            }
          }
          auVar7 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            uVar12 = uStack_b0 & 0xffffffff;
            if (uVar12 != 0) {
              lVar22 = 0;
              do {
                pvVar5 = *(void **)((long)(uint **)auVar7 + lVar22);
                if (pvVar5 != (void *)0x0) {
                  crnlib_free(pvVar5);
                }
                lVar22 = lVar22 + 0x10;
              } while (uVar12 << 4 != lVar22);
            }
            crnlib_free((void *)local_b8);
          }
        }
        if (bVar24) break;
      }
    }
    bVar24 = lVar21 == 0;
    bVar23 = !bVar24;
    lVar21 = lVar21 + 1;
  } while (bVar24);
  lVar21 = 0x20;
  do {
    if (*(void **)((long)local_68 + lVar21) != (void *)0x0) {
      crnlib_free(*(void **)((long)local_68 + lVar21));
    }
    lVar21 = lVar21 + -0x10;
  } while (lVar21 != 0);
  lVar21 = 0x20;
  do {
    if (*(void **)((long)local_88 + lVar21) != (void *)0x0) {
      crnlib_free(*(void **)((long)local_88 + lVar21));
    }
    lVar21 = lVar21 + -0x10;
  } while (lVar21 != 0);
  return bVar23;
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        weighted_selector_vec_array selector_vecs[2];
        crnlib::vector<uint> selector_vec_remap[2];

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
            {
                dxt5_block& dxt5_block = get_block(block_iter);
                if ((uint)dxt5_block.is_alpha6_block() != block_type)
                {
                    continue;
                }

                vec16F sv;
                float* pDst = &sv[0];

                bool uses_absolute_values = false;

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        const uint s = dxt5_block.get_selector(x, y);

                        float f;
                        if (dxt5_block.is_alpha6_block())
                        {
                            if (s >= 6)
                            {
                                uses_absolute_values = true;
                                f = 0.0f;
                            }
                            else
                            {
                                f = g_dxt5_alpha6_to_linear[s];
                            }
                        }
                        else
                        {
                            f = g_dxt5_to_linear[s];
                        }

                        *pDst++ = f;
                    }
                }

                if (uses_absolute_values)
                {
                    continue;
                }

                int low_alpha = dxt5_block.get_low_alpha();
                int high_alpha = dxt5_block.get_high_alpha();
                int dist = math::square(low_alpha - high_alpha);

                const uint cAlphaDistToWeight = 8;
                const uint cMaxWeight = 2048;
                uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

                selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
                selector_vecs[block_type].back().m_vec = sv;
                selector_vecs[block_type].back().m_weight = weight;

                selector_vec_remap[block_type].push_back(block_iter);
            }
        }

        selector_cluster_indices.clear();

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            if (selector_vecs[block_type].empty())
            {
                continue;
            }

            if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
            {
                continue;
            }
            uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
            max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
            if (max_clusters >= selector_vecs[block_type].size())
            {
                continue;
            }

#if QDXT5_DEBUGGING
            trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

            crnlib::vector<crnlib::vector<uint>> block_type_selector_cluster_indices;

            if (!block_type)
            {
                m_progress_start = m_progress_range;
                m_progress_range = 16;
            }
            else
            {
                m_progress_start = m_progress_range + 16;
                m_progress_range = 17;
            }

            if (!m_selector_clusterizer.create_clusters(
                    selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this))
            {
                return false;
            }

            const uint first_cluster = selector_cluster_indices.size();
            selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

            for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++)
            {
                crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
                indices.swap(block_type_selector_cluster_indices[i]);

                for (uint j = 0; j < indices.size(); j++)
                {
                    indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
                }
            }
        }

        return true;
    }